

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

StructSchema __thiscall capnp::Schema::asStruct(Schema *this)

{
  Schema SVar1;
  Fault f;
  ArrayPtr<const_char> local_68;
  WirePointer *local_58;
  int local_50;
  StructReader local_40;
  
  local_58 = (WirePointer *)this->raw->generic->encodedNode;
  local_68 = (ArrayPtr<const_char>)ZEXT816(0);
  local_50 = 0x7fffffff;
  _::PointerReader::getStruct(&local_40,(PointerReader *)&local_68,(word *)0x0);
  if ((local_40.dataSize < 0x70) || (*(short *)((long)local_40.data + 0xc) != 1)) {
    local_58 = (WirePointer *)this->raw->generic->encodedNode;
    local_68 = (ArrayPtr<const_char>)ZEXT816(0);
    local_50 = 0x7fffffff;
    _::PointerReader::getStruct(&local_40,(PointerReader *)&local_68,(word *)0x0);
    local_68 = (ArrayPtr<const_char>)
               capnp::schema::Node::Reader::getDisplayName((Reader *)&local_40);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44],capnp::Text::Reader>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x10d,FAILED,"getProto().isStruct()",
               "\"Tried to use non-struct schema as a struct.\", getProto().getDisplayName()",
               (char (*) [44])"Tried to use non-struct schema as a struct.",(Reader *)&local_68);
    kj::_::Debug::Fault::~Fault(&f);
    SVar1.raw = (RawBrandedSchema *)(_::NULL_STRUCT_SCHEMA + 0x48);
  }
  else {
    SVar1 = (Schema)this->raw;
  }
  return (StructSchema)SVar1.raw;
}

Assistant:

StructSchema Schema::asStruct() const {
  KJ_REQUIRE(getProto().isStruct(), "Tried to use non-struct schema as a struct.",
             getProto().getDisplayName()) {
    return StructSchema();
  }
  return StructSchema(*this);
}